

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::compute_delta(image_u8 *dest,image_u8 *a,image_u8 *b,uint scale)

{
  image_u8 *this;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  color_quad<unsigned_char,_int> *pcVar6;
  uchar *puVar7;
  uint local_50;
  int d;
  uint c;
  color_quad_u8 cd;
  color_quad_u8 *cb;
  color_quad_u8 *ca;
  uint x;
  uint y;
  image_u8 *piStack_28;
  uint scale_local;
  image_u8 *b_local;
  image_u8 *a_local;
  image_u8 *dest_local;
  
  y = scale;
  piStack_28 = b;
  b_local = a;
  a_local = dest;
  uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(a);
  uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(piStack_28);
  if (uVar3 == uVar4) {
    uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(b_local);
    uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(piStack_28);
    this = a_local;
    if (uVar3 == uVar4) {
      uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(b_local);
      uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(piStack_28);
      color_quad<unsigned_char,_int>::make_black();
      image<crnlib::color_quad<unsigned_char,_int>_>::resize
                (this,uVar3,uVar4,0xffffffff,(color_quad<unsigned_char,_int> *)&x);
      for (ca._4_4_ = 0; uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(b_local)
          , ca._4_4_ < uVar3; ca._4_4_ = ca._4_4_ + 1) {
        for (ca._0_4_ = 0;
            uVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(b_local),
            (uint)ca < uVar3; ca._0_4_ = (uint)ca + 1) {
          pcVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                             (b_local,(uint)ca,ca._4_4_);
          _c = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                         (piStack_28,(uint)ca,ca._4_4_);
          color_quad<unsigned_char,_int>::color_quad((color_quad<unsigned_char,_int> *)&d);
          for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
            bVar1 = color_quad<unsigned_char,_int>::operator[](pcVar6,local_50);
            bVar2 = color_quad<unsigned_char,_int>::operator[](_c,local_50);
            iVar5 = math::clamp<int>(((uint)bVar1 - (uint)bVar2) * y + 0x80,0,0xff);
            puVar7 = color_quad<unsigned_char,_int>::operator[]
                               ((color_quad<unsigned_char,_int> *)&d,local_50);
            *puVar7 = (uchar)iVar5;
          }
          pcVar6 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                             (a_local,(uint)ca,ca._4_4_);
          color_quad<unsigned_char,_int>::operator=(pcVar6,(color_quad<unsigned_char,_int> *)&d);
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool compute_delta(image_u8& dest, image_u8& a, image_u8& b, uint scale)
        {
            if ((a.get_width() != b.get_width()) || (a.get_height() != b.get_height()))
            {
                return false;
            }

            dest.resize(a.get_width(), b.get_height());

            for (uint y = 0; y < a.get_height(); y++)
            {
                for (uint x = 0; x < a.get_width(); x++)
                {
                    const color_quad_u8& ca = a(x, y);
                    const color_quad_u8& cb = b(x, y);

                    color_quad_u8 cd;
                    for (uint c = 0; c < 4; c++)
                    {
                        int d = (ca[c] - cb[c]) * scale + 128;
                        d = math::clamp(d, 0, 255);
                        cd[c] = static_cast<uint8>(d);
                    }

                    dest(x, y) = cd;
                }
            }

            return true;
        }